

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

allocator_base<custom::Allocator<unsigned_char,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>_>
* __thiscall
poly::vector_impl::
allocator_base<custom::Allocator<unsigned_char,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>_>
::copy_assign_impl(allocator_base<custom::Allocator<unsigned_char,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>_>
                   *this,long *a)

{
  pointer puVar1;
  allocator_type a_copy;
  Allocator<unsigned_char,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>
  local_19;
  
  if (a[1] - *a == 0) {
    puVar1 = (pointer)0x0;
  }
  else {
    puVar1 = custom::
             Allocator<unsigned_char,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>
             ::allocate(&local_19,a[1] - *a);
  }
  tidy(this);
  this->_storage = puVar1;
  this->_end_storage = puVar1 + (a[1] - *a);
  return this;
}

Assistant:

allocator_base& copy_assign_impl(const allocator_base& a, std::true_type /*unused*/)
        {
            static_assert(std::is_nothrow_copy_assignable<allocator_type>::value,
                "allocator copy assignment must not throw");
            pointer s      = nullptr;
            auto    a_copy = a.get_allocator_ref();
            if (a.size()) {
                s = a_copy.allocate(a.size());
            }
            tidy();
            get_allocator_ref() = std::move(a_copy);
            _storage            = s;
            _end_storage        = s + a.size();
            return *this;
        }